

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetAttachmentParametersTest::CreateTextureFramebuffer
          (GetAttachmentParametersTest *this,bool depth,bool stencil)

{
  int iVar1;
  deUint32 dVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  undefined4 *puVar5;
  undefined1 local_1b0 [384];
  long lVar4;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x6d0))(1,&this->m_fbo);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x102b);
  (**(code **)(lVar4 + 0x78))(0x8d40,this->m_fbo);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x102e);
  (**(code **)(lVar4 + 0x6f8))(2,this->m_to);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGenRenderbuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1031);
  (**(code **)(lVar4 + 0xb8))(0xde1,this->m_to[0]);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindRenderbuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1034);
  (**(code **)(lVar4 + 0x1380))(0xde1,1,0x8058,1,2);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glRenderbufferStorage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1037);
  (**(code **)(lVar4 + 0x6a0))(0x8d40,0x8ce0,0xde1,this->m_to[0],0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glFramebufferRenderbuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x103a);
  if (depth && !stencil) {
    (**(code **)(lVar4 + 0xb8))(0xde1,this->m_to[1]);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glBindRenderbuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x103f);
    (**(code **)(lVar4 + 0x1380))(0xde1,1,0x81a6,1,2);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glRenderbufferStorage has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x1042);
    (**(code **)(lVar4 + 0x6a0))(0x8d40,0x8d00,0xde1,this->m_to[1],0);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glFramebufferRenderbuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x1045);
  }
  if (!depth && stencil) {
    (**(code **)(lVar4 + 0xb8))(0xde1,this->m_to[1]);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glBindRenderbuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x104b);
    (**(code **)(lVar4 + 0x1380))(0xde1,1,0x8d48,1,2);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glRenderbufferStorage has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x104e);
    (**(code **)(lVar4 + 0x6a0))(0x8d40,0x8d20,0xde1,this->m_to[1],0);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glFramebufferRenderbuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x1051);
  }
  if (depth && stencil) {
    (**(code **)(lVar4 + 0xb8))(0xde1,this->m_to[1]);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glBindRenderbuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x1057);
    (**(code **)(lVar4 + 0x1380))(0xde1,1,0x88f0,1,2);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glRenderbufferStorage has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x105a);
    (**(code **)(lVar4 + 0x6a0))(0x8d40,0x821a,0xde1,this->m_to[1],0);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glFramebufferRenderbuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x105d);
  }
  GVar3 = glwCheckFramebufferStatus(0x8d40);
  if (GVar3 == 0x8cd5) {
    return;
  }
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b0 + 8),"Unexpectedly framebuffer was incomplete.",0x28);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1b0);
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 0;
  __cxa_throw(puVar5,&int::typeinfo,0);
}

Assistant:

void GetAttachmentParametersTest::CreateTextureFramebuffer(bool depth, bool stencil)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genFramebuffers(1, &m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffers has failed");

	gl.genTextures(2, m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers has failed");

	gl.bindTexture(GL_TEXTURE_2D, m_to[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffers has failed");

	gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 1, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_to[0], 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");

	if (depth && (!stencil))
	{
		gl.bindTexture(GL_TEXTURE_2D, m_to[1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffers has failed");

		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_DEPTH_COMPONENT24, 1, 2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, m_to[1], 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");
	}

	if ((!depth) && stencil)
	{
		gl.bindTexture(GL_TEXTURE_2D, m_to[1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffers has failed");

		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_STENCIL_INDEX8, 1, 2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_TEXTURE_2D, m_to[1], 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");
	}

	if (depth && stencil)
	{
		gl.bindTexture(GL_TEXTURE_2D, m_to[1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffers has failed");

		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_DEPTH24_STENCIL8, 1, 2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_TEXTURE_2D, m_to[1], 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");
	}

	/* Check that framebuffer is complete. */
	if (GL_FRAMEBUFFER_COMPLETE != glCheckFramebufferStatus(GL_FRAMEBUFFER))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Unexpectedly framebuffer was incomplete."
											<< tcu::TestLog::EndMessage;

		throw 0;
	}
}